

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kinsol_io.c
# Opt level: O0

int KINSetScaledStepTol(void *kinmem,realtype scsteptol)

{
  realtype rVar1;
  realtype uround;
  KINMem kin_mem;
  realtype scsteptol_local;
  void *kinmem_local;
  
  if (kinmem == (void *)0x0) {
    KINProcessError((KINMem)0x0,-1,"KINSOL","KINSetScaledStepTol","kinsol_mem = NULL illegal.");
    kinmem_local._4_4_ = -1;
  }
  else if (0.0 <= scsteptol) {
    if ((scsteptol != 0.0) || (NAN(scsteptol))) {
      *(realtype *)((long)kinmem + 0x20) = scsteptol;
    }
    else {
      rVar1 = SUNRpowerR(*kinmem,0.6666666666666667);
      *(realtype *)((long)kinmem + 0x20) = rVar1;
    }
    kinmem_local._4_4_ = 0;
  }
  else {
    KINProcessError((KINMem)0x0,-2,"KINSOL","KINSetScaledStepTol","scsteptol < 0 illegal.");
    kinmem_local._4_4_ = -2;
  }
  return kinmem_local._4_4_;
}

Assistant:

int KINSetScaledStepTol(void *kinmem, realtype scsteptol)
{
  KINMem kin_mem;
  realtype uround;

  if (kinmem == NULL) {
    KINProcessError(NULL, KIN_MEM_NULL, "KINSOL", "KINSetScaledStepTol", MSG_NO_MEM);
    return(KIN_MEM_NULL);
  }

  kin_mem = (KINMem) kinmem;

  if (scsteptol < ZERO) {
    KINProcessError(NULL, KIN_ILL_INPUT, "KINSOL", "KINSetScaledStepTol", MSG_BAD_SCSTEPTOL);
    return(KIN_ILL_INPUT);
  }

  if (scsteptol == ZERO) {
    uround = kin_mem->kin_uround;
    kin_mem->kin_scsteptol = SUNRpowerR(uround,TWOTHIRDS);
  } else {
    kin_mem->kin_scsteptol = scsteptol;
  }

  return(KIN_SUCCESS);
}